

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

bool __thiscall Jinx::Impl::Parser::ParseStatement(Parser *this)

{
  VariableStackFrame *this_00;
  size_t sVar1;
  SymbolListCItr endSymbol;
  Symbol *pSVar2;
  size_t sVar3;
  bool bVar4;
  uint32_t uVar5;
  pointer pSVar6;
  mapped_type *this_01;
  SymbolList *pSVar7;
  pointer pSVar8;
  pointer pSVar9;
  VisibilityType scope;
  Opcode opcode;
  char *pcVar10;
  byte bVar11;
  bool bVar12;
  size_t *pos;
  bool readOnly;
  byte bVar13;
  ValueType VVar14;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  String name;
  FunctionMatch functionMatch;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *local_b0;
  undefined1 local_a8 [16];
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_98 [2];
  FunctionMatch local_48;
  
  if (this->m_error != false) {
    return false;
  }
  CheckFunctionCall(&local_48,this,false,(this->m_currentSymbol)._M_current,
                    (this->m_symbolList->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish);
  if (local_48.signature != (FunctionSignature *)0x0) {
    ParseFunctionCall(this,&local_48);
    EmitOpcode(this,Pop);
    bVar12 = false;
    Expect(this,NewLine,(char *)0x0);
    goto LAB_0012e6a3;
  }
  pcVar10 = "Unknown symbol in statement";
  if (this->m_error != false) goto LAB_0012e4da;
  pSVar7 = this->m_symbolList;
  pSVar6 = (this->m_currentSymbol)._M_current;
  pSVar8 = (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  scope = Local;
  if ((pSVar6 == pSVar8) || (pSVar6->type != Set)) {
    bVar12 = false;
  }
  else {
    this->m_lastLine = pSVar6->lineNumber;
    pSVar6 = pSVar6 + 1;
    (this->m_currentSymbol)._M_current = pSVar6;
    pSVar8 = (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    bVar12 = true;
  }
  pSVar9 = pSVar6;
  if (pSVar6 == pSVar8) {
LAB_0012e595:
    bVar4 = scope == Local;
    readOnly = false;
LAB_0012e59e:
    if (pSVar6 != pSVar9) {
      if (pSVar6->type == Function) {
        this->m_lastLine = pSVar6->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar6 + 1;
        ParseFunctionDefinition(this,scope);
        goto LAB_0012e69a;
      }
      if ((!bVar12) || (pSVar6->type != NameValue)) goto LAB_0012e606;
      bVar12 = std::operator==(&pSVar6->text,
                               &((this->m_library).
                                 super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->m_name);
      if (bVar12) {
        pcVar10 = "Illegal use of library name in identifier";
        goto LAB_0012e6ea;
      }
      if (bVar4) {
        bVar12 = CheckProperty(this,(this->m_currentSymbol)._M_current,(size_t *)0x0);
        if (bVar12) {
          ParsePropertyName((PropertyName *)local_a8,this);
          if ((bool)local_a8[0xc] == true) {
            Error<>(this,"Can\'t change readonly property");
            PropertyName::~PropertyName((PropertyName *)local_a8);
            goto LAB_0012e6f2;
          }
          uVar5 = ParseSubscriptSet(this);
          Expect(this,To,(char *)0x0);
          ParseExpression(this,(this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
          Expect(this,NewLine,(char *)0x0);
          if (uVar5 == 0) {
            EmitOpcode(this,SetProp);
          }
          else {
            EmitOpcode(this,SetPropKeyVal);
            local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       CONCAT44(local_b0._4_4_,uVar5);
            Buffer::Write((this->m_writer).m_buffer.
                          super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &(this->m_writer).m_pos,&local_b0,4);
          }
          local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     local_a8._0_8_;
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &(this->m_writer).m_pos,&local_b0,8);
          local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     local_a8._0_8_;
          this_01 = std::
                    map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                    ::operator[](&this->m_idNameMap,(key_type *)&local_b0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          _M_assign(this_01,local_98);
          PropertyName::~PropertyName((PropertyName *)local_a8);
        }
        else {
          local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     0x140000003f;
          symbols._M_len = 2;
          symbols._M_array = (iterator)&local_b0;
          ParseMultiName_abi_cxx11_((String *)local_a8,this,symbols);
          uVar5 = ParseSubscriptSet(this);
          Expect(this,To,(char *)0x0);
          ParseExpression(this,(this->m_symbolList->
                               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                               )._M_impl.super__Vector_impl_data._M_finish);
          Expect(this,NewLine,"Unable to parse expression");
          VariableAssign(this,(String *)local_a8);
          if (uVar5 == 0) {
            EmitOpcode(this,SetVar);
          }
          else {
            EmitOpcode(this,SetVarKeyVal);
            local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       CONCAT44(local_b0._4_4_,uVar5);
            Buffer::Write((this->m_writer).m_buffer.
                          super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &(this->m_writer).m_pos,&local_b0,4);
          }
          local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                     VariableNameToRuntimeID(this,(String *)local_a8);
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &(this->m_writer).m_pos,&local_b0,8);
LAB_0012e91a:
          if ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_a8._0_8_
              != local_98) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            _M_destroy((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                       local_a8,(size_type)local_98[0]._M_dataplus._M_p);
          }
        }
      }
      else {
        ParsePropertyDeclaration(this,scope,readOnly);
      }
LAB_0012e69a:
      bVar11 = 1;
      goto LAB_0012e69d;
    }
LAB_0012e606:
    if (!bVar4) {
      local_a8._0_8_ = "private";
      if (scope == Public) {
        local_a8._0_8_ = "public";
      }
      Error<char_const*>(this,"Invalid symbol after scope specifier \'%s\'",(char **)local_a8);
      goto LAB_0012e69a;
    }
    if (pSVar6 == pSVar9) goto LAB_0012e4da;
    if (pSVar6->type != Begin) {
      if (pSVar6->type == If) {
        this->m_lastLine = pSVar6->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar6 + 1;
        ParseIfElse(this);
      }
      else if (pSVar6->type == Loop) {
        this->m_lastLine = pSVar6->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar6 + 1;
        ParseLoop(this);
      }
      else if (pSVar6->type == Erase) {
        this->m_lastLine = pSVar6->lineNumber;
        (this->m_currentSymbol)._M_current = pSVar6 + 1;
        ParseErase(this);
      }
      else if ((pSVar6->type == Increment) || (pSVar6->type == Decrement)) {
        ParseIncDec(this);
      }
      else {
        if (pSVar6->type == Return) {
          this->m_lastLine = pSVar6->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar6 + 1;
          bVar12 = VariableStackFrame::IsRootFrame(&this->m_variableStackFrame);
          if (bVar12) {
            if (((this->m_error != false) ||
                (pSVar6 = (this->m_currentSymbol)._M_current,
                pSVar6 == (this->m_symbolList->
                          super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                          )._M_impl.super__Vector_impl_data._M_finish)) || (pSVar6->type != NewLine)
               ) {
              LogWriteLine(Warning,"Return values at root scope do nothing");
              ParseExpression(this,(this->m_symbolList->
                                   super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                   )._M_impl.super__Vector_impl_data._M_finish);
            }
            EmitOpcode(this,Exit);
          }
          else {
            endSymbol._M_current =
                 (this->m_symbolList->
                 super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (((this->m_error == false) &&
                (pSVar2 = (this->m_currentSymbol)._M_current, pSVar2 != endSymbol._M_current)) &&
               (pSVar2->type == NewLine)) {
              EmitOpcode(this,PushVal);
              local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
              Variant::SetNull((Variant *)local_a8);
              Variant::Write((Variant *)local_a8,&this->m_writer);
              Variant::~Variant((Variant *)local_a8);
            }
            else {
              ParseExpression(this,endSymbol);
            }
            EmitOpcode(this,Return);
          }
          bVar11 = 1;
          if (((this->m_error == false) &&
              (pSVar6 = (this->m_currentSymbol)._M_current,
              pSVar6 != (this->m_symbolList->
                        super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                        )._M_impl.super__Vector_impl_data._M_finish)) && (pSVar6->type == NewLine))
          {
            this->m_lastLine = pSVar6->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar6 + 1;
          }
          bVar13 = 1;
          goto LAB_0012e6a0;
        }
        if (pSVar6->type == Break) {
          this->m_lastLine = pSVar6->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar6 + 1;
          Expect(this,NewLine,(char *)0x0);
          EmitOpcode(this,Jump);
          sVar1 = (this->m_writer).m_pos;
          local_a8._0_8_ = (ulong)(uint)local_a8._4_4_ << 0x20;
          Buffer::Write((this->m_writer).m_buffer.
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        &(this->m_writer).m_pos,local_a8,4);
          this->m_breakAddress = sVar1;
        }
        else {
          if (pSVar6->type == Wait) {
            this->m_lastLine = pSVar6->lineNumber;
            pSVar8 = pSVar6 + 1;
            (this->m_currentSymbol)._M_current = pSVar8;
            pcVar10 = "Unexpected symbol after wait";
            if (pSVar8 != (pSVar7->
                          super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                          )._M_impl.super__Vector_impl_data._M_finish) {
              if (pSVar8->type == NewLine) {
                this->m_lastLine = pSVar6[1].lineNumber;
                (this->m_currentSymbol)._M_current = pSVar6 + 2;
                EmitOpcode(this,Wait);
              }
              else {
                if (pSVar8->type == Until) {
                  VVar14 = (ValueType)(this->m_writer).m_pos;
                  this->m_lastLine = pSVar6[1].lineNumber;
                  (this->m_currentSymbol)._M_current = pSVar6 + 2;
                  opcode = JumpTrue;
                }
                else {
                  if (pSVar8->type != While) goto LAB_0012e4da;
                  VVar14 = (ValueType)(this->m_writer).m_pos;
                  Expect(this,While,(char *)0x0);
                  pSVar7 = this->m_symbolList;
                  opcode = JumpFalse;
                }
                pos = &(this->m_writer).m_pos;
                ParseExpression(this,(pSVar7->
                                     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                                     )._M_impl.super__Vector_impl_data._M_finish);
                bVar12 = Expect(this,NewLine,(char *)0x0);
                if (!bVar12) goto LAB_0012e6f2;
                EmitOpcode(this,opcode);
                sVar1 = (this->m_writer).m_pos;
                local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
                Buffer::Write((this->m_writer).m_buffer.
                              super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              pos,local_a8,4);
                EmitOpcode(this,Wait);
                EmitOpcode(this,Jump);
                local_a8._0_4_ = VVar14;
                Buffer::Write((this->m_writer).m_buffer.
                              super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              pos,local_a8,4);
                sVar3 = (this->m_writer).m_pos;
                (this->m_writer).m_pos = sVar1;
                local_a8._0_4_ = (int)sVar3;
                Buffer::Write((this->m_writer).m_buffer.
                              super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              pos,local_a8,4);
                *pos = sVar3;
              }
              goto LAB_0012e69a;
            }
          }
          else if (pSVar6->type == External) {
            this->m_lastLine = pSVar6->lineNumber;
            (this->m_currentSymbol)._M_current = pSVar6 + 1;
            bVar12 = CheckProperty(this,pSVar6 + 1,(size_t *)0x0);
            ParseMultiName_abi_cxx11_
                      ((String *)local_a8,this,(initializer_list<Jinx::Impl::SymbolType>)ZEXT816(0))
            ;
            this_00 = &this->m_variableStackFrame;
            bVar4 = VariableStackFrame::IsRootFrame(this_00);
            if (bVar4) {
              bVar4 = VariableStackFrame::IsRootScope(this_00);
              if (bVar4) {
                if (bVar12) {
                  local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                             local_a8._0_8_;
                  Error<char_const*>(this,"External variable \'%s\' is already a property name",
                                     (char **)&local_b0);
                }
                else {
                  bVar12 = VariableStackFrame::VariableExists(this_00,(String *)local_a8);
                  if (bVar12) {
                    local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *
                               )local_a8._0_8_;
                    Error<char_const*>(this,"Variable \'%s\' already exists",(char **)&local_b0);
                  }
                  else {
                    bVar12 = VariableStackFrame::VariableAssign(this_00,(String *)local_a8);
                    if (!bVar12) {
                      local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                                  *)local_a8._0_8_;
                      Error<char_const*>(this,"Error creating external variable \'%s\'",
                                         (char **)&local_b0);
                    }
                  }
                }
              }
              else {
                local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                           local_a8._0_8_;
                Error<char_const*>(this,
                                   "External variable \'%s\' must be declared at the root scope",
                                   (char **)&local_b0);
              }
            }
            else {
              local_b0 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                         local_a8._0_8_;
              Error<char_const*>(this,"External variable \'%s\' can\'t be declared in a function",
                                 (char **)&local_b0);
            }
            Expect(this,NewLine,(char *)0x0);
            goto LAB_0012e91a;
          }
LAB_0012e4da:
          Error<>(this,pcVar10);
        }
      }
      goto LAB_0012e69a;
    }
    this->m_lastLine = pSVar6->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar6 + 1;
    Expect(this,NewLine,(char *)0x0);
    ParseBlock(this);
    Expect(this,End,(char *)0x0);
    bVar13 = 0;
    Expect(this,NewLine,(char *)0x0);
    bVar11 = 1;
  }
  else {
    if (pSVar6->type == Private) {
      scope = Private;
LAB_0012e54b:
      this->m_lastLine = pSVar6->lineNumber;
      pSVar6 = pSVar6 + 1;
      (this->m_currentSymbol)._M_current = pSVar6;
      pSVar8 = (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      scope = Local;
      if (pSVar6->type == Public) {
        scope = Public;
        goto LAB_0012e54b;
      }
    }
    pSVar9 = pSVar8;
    if ((pSVar6 == pSVar8) || (pSVar6->type != Readonly)) goto LAB_0012e595;
    this->m_lastLine = pSVar6->lineNumber;
    pSVar6 = pSVar6 + 1;
    (this->m_currentSymbol)._M_current = pSVar6;
    if (scope != Local) {
      pSVar9 = (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      readOnly = true;
      bVar4 = false;
      goto LAB_0012e59e;
    }
    pcVar10 = "The \'readonly\' keyword must follow a private or public keyword";
LAB_0012e6ea:
    Error<>(this,pcVar10);
LAB_0012e6f2:
    bVar11 = 0;
LAB_0012e69d:
    bVar13 = 0;
  }
LAB_0012e6a0:
  bVar12 = (bool)(bVar11 & bVar13);
LAB_0012e6a3:
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&local_48.partData.
                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 );
  return bVar12;
}

Assistant:

inline_t bool Parser::ParseStatement()
	{
		// No need to continue if an error has been flagged
		if (m_error)
			return false;

		bool returnedValue = false;

		// Functions signatures have precedence over everything, so check for a 
		// potential signature match before anything else.
		const auto functionMatch = CheckFunctionCall();
		if (functionMatch.signature)
		{
			// We found a valid function signature that matches the current token(s)
			ParseFunctionCall(functionMatch);

			// Since all functions return a value, we need to discard the return
			// value not on the stack, since we're not assigning it to a variable.
			EmitOpcode(Opcode::Pop);
			Expect(SymbolType::NewLine);
		}
		else
		{
			bool set = Accept(SymbolType::Set);

			// Parse scope level
			VisibilityType scope = ParseScope();

			// Parse optional readonly, which can only apply to properties
			bool readOnly = Accept(SymbolType::Readonly);
			if (readOnly)
			{
				if (scope == VisibilityType::Local)
				{
					Error("The 'readonly' keyword must follow a private or public keyword");
					return false;
				}
			}

			if (Accept(SymbolType::Function))
			{
				// We're parsing a function definition
				ParseFunctionDefinition(scope);
			}
			else if (set && CheckName())
			{
				// Can't use the current library name or preface the variable with it
				if (m_currentSymbol->text == m_library->GetName())
				{
					Error("Illegal use of library name in identifier");
					return false;
				}

				// We're declaring a new property if we see a non-local scope declaration
				if (scope != VisibilityType::Local)
				{
					ParsePropertyDeclaration(scope, readOnly);
				}
				// Either this is an existing property or a variable
				else
				{
					// Check to see if this is an existing property
					if (CheckProperty())
					{
						// Get the property name
						auto propertyName = ParsePropertyName();

						// Make sure we're not trying to assign a value to a readonly property
						if (propertyName.IsReadOnly())
						{
							Error("Can't change readonly property");
							return false;
						}

						// Check for subscript operators
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine);

						// Assign property
						if (subscripts)
						{
							EmitOpcode(Opcode::SetPropKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetProp);

						EmitId(propertyName.GetId());
						m_idNameMap[propertyName.GetId()] = propertyName.GetName();
					}
					// Otherwise we're just dealing with an ordinary variable
					else
					{
						// Get the variable name
						String name = ParseMultiName({ SymbolType::To, SymbolType::SquareOpen });

						// Check for subscript operator
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine, "Unable to parse expression");

						// Add to variable table
						VariableAssign(name);

						// Assign a variable. 
						if (subscripts)
						{
							EmitOpcode(Opcode::SetVarKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetVar);
						EmitId(VariableNameToRuntimeID(name));
					}
				}
			}
			else if (scope == VisibilityType::Local)
			{
				if (Accept(SymbolType::Begin))
				{
					// We're parsing a begin/end block
					Expect(SymbolType::NewLine);
					ParseBlock();
					Expect(SymbolType::End);
					Expect(SymbolType::NewLine);
				}
				else if (Accept(SymbolType::If))
				{
					// We're parsing an if or if/else block
					ParseIfElse();
				}
				else if (Accept(SymbolType::Loop))
				{
					// We're parsing a loop block
					ParseLoop();
				}
				else if (Accept(SymbolType::Erase))
				{
					// We're parsing an erase operation
					ParseErase();
				}
				else if (Check(SymbolType::Increment) || Check(SymbolType::Decrement))
				{
					// We're parsing an increment or decrement statement
					ParseIncDec();
				}
				else if (Accept(SymbolType::Return))
				{
					// We've hit a return value.  There are different behaviors depending whether or
					// not we're at the base scope or not.
					if (m_variableStackFrame.IsRootFrame())
					{
						if (!Check(SymbolType::NewLine))
						{
							LogWriteLine(LogLevel::Warning, "Return values at root scope do nothing");
							ParseExpression();
						}
						EmitOpcode(Opcode::Exit);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
					else
					{
						if (!Check(SymbolType::NewLine))
						{
							ParseExpression();
						}
						else
						{
							EmitOpcode(Opcode::PushVal);
							EmitValue(nullptr);
						}
						EmitOpcode(Opcode::Return);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
				}
				else if (Accept(SymbolType::Break))
				{
					// We've hit a break statement
					Expect(SymbolType::NewLine);
					EmitOpcode(Opcode::Jump);
					m_breakAddress = EmitAddressPlaceholder();
				}
				else if (Accept(SymbolType::Wait))
				{
					// Check for basic wait statement
					if (Accept(SymbolType::NewLine))
						EmitOpcode(Opcode::Wait);
					else if (Check(SymbolType::Until) || Check(SymbolType::While))
					{
						// Store expression address
						auto expressionAddress = m_writer.Tell();

						// Check which keyword was used
						bool jumpTrue = Accept(SymbolType::Until);
						if (!jumpTrue)
							Expect(SymbolType::While);

						// Parse the expression to check for wait
						ParseExpression();
						if (!Expect(SymbolType::NewLine))
							return false;

						// Add jump if false/true over wait statement depending on keyword
						EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);

						// Mark placeholder for later jump address insertion
						auto addressPlaceholder = EmitAddressPlaceholder();

						// Wait statement is executed if expression is true
						EmitOpcode(Opcode::Wait);
						EmitOpcode(Opcode::Jump);
						EmitAddress(expressionAddress);

						// Backfill placeholder at end of conditional wait statement
						EmitAddressBackfill(addressPlaceholder);
					}
					else
					{
						Error("Unexpected symbol after wait");
					}
				}
				else if (Accept(SymbolType::External))
				{
					// First check to see if this collides with an existing property name
					bool propExists = CheckProperty();

					// Get the variable name
					String name = ParseMultiName({ });

					// Validate the name is legal and register it as a variable name
					if (!m_variableStackFrame.IsRootFrame())
						Error("External variable '%s' can't be declared in a function", name.c_str());
					else if (!m_variableStackFrame.IsRootScope())
						Error("External variable '%s' must be declared at the root scope", name.c_str());
					else if (propExists)
						Error("External variable '%s' is already a property name", name.c_str());
					else if (m_variableStackFrame.VariableExists(name))
						Error("Variable '%s' already exists", name.c_str());
					else if (!m_variableStackFrame.VariableAssign(name))
						Error("Error creating external variable '%s'", name.c_str());

					Expect(SymbolType::NewLine);
				}
				else
				{
					Error("Unknown symbol in statement");
				}
			}
			else
			{
				Error("Invalid symbol after scope specifier '%s'", scope == VisibilityType::Public ? "public" : "private");
			}
		}

		// This is not an error value, but signals whether we've returned a value from this statement
		return returnedValue;
	}